

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

int cmsysProcess_WaitForData(cmsysProcess *cp,char **data,int *length,double *userTimeout)

{
  int iVar1;
  bool bVar2;
  double dVar3;
  kwsysProcessTime kVar4;
  kwsysProcessTime in1;
  double d;
  kwsysProcessTime difference;
  kwsysProcessTime userEndTime;
  long local_70;
  undefined1 local_68 [8];
  kwsysProcessWaitData wd;
  kwsysProcessTime userStartTime;
  double *userTimeout_local;
  int *length_local;
  char **data_local;
  cmsysProcess *cp_local;
  
  memset(&wd.TimeoutTime.tv_usec,0,0x10);
  memset(local_68,0,0x28);
  if ((((cp == (cmsysProcess *)0x0) || (cp->State != 3)) || (cp->Killed != 0)) ||
     (cp->TimeoutExpired != 0)) {
    cp_local._4_4_ = 0;
  }
  else {
    wd._8_8_ = userTimeout;
    if (userTimeout != (double *)0x0) {
      kVar4 = kwsysProcessTimeGetCurrent();
      userEndTime.tv_usec = kVar4.tv_sec;
      wd.TimeoutTime.tv_usec = userEndTime.tv_usec;
      local_70 = kVar4.tv_usec;
      userStartTime.tv_sec = local_70;
    }
    wd.Expired = kwsysProcessGetTimeoutTime(cp,userTimeout,(kwsysProcessTime *)&wd.UserTimeout);
    do {
      bVar2 = false;
      if (0 < cp->PipesLeft) {
        iVar1 = kwsysProcessWaitForPipe(cp,data,length,(kwsysProcessWaitData *)local_68);
        bVar2 = iVar1 == 0;
      }
    } while (bVar2);
    if (userTimeout != (double *)0x0) {
      in1 = kwsysProcessTimeGetCurrent();
      kVar4.tv_usec = userStartTime.tv_sec;
      kVar4.tv_sec = wd.TimeoutTime.tv_usec;
      kVar4 = kwsysProcessTimeSubtract(in1,kVar4);
      dVar3 = kwsysProcessTimeToDouble(kVar4);
      *userTimeout = *userTimeout - dVar3;
      if (*userTimeout <= 0.0 && *userTimeout != 0.0) {
        *userTimeout = 0.0;
      }
    }
    if (local_68._4_4_ == 0) {
      if (local_68._0_4_ == 0) {
        cp_local._4_4_ = 0;
      }
      else if (wd.Expired == 0) {
        cmsysProcess_Kill(cp);
        cp->Killed = 0;
        cp->TimeoutExpired = 1;
        cp_local._4_4_ = 0;
      }
      else {
        cp_local._4_4_ = 0xff;
      }
    }
    else {
      cp_local._4_4_ = local_68._4_4_;
    }
  }
  return cp_local._4_4_;
}

Assistant:

int kwsysProcess_WaitForData(kwsysProcess* cp, char** data, int* length,
                             double* userTimeout)
{
  kwsysProcessTime userStartTime = { 0, 0 };
  kwsysProcessWaitData wd = { 0, kwsysProcess_Pipe_None, 0, 0, { 0, 0 } };
  wd.UserTimeout = userTimeout;
  /* Make sure we are executing a process.  */
  if (!cp || cp->State != kwsysProcess_State_Executing || cp->Killed ||
      cp->TimeoutExpired) {
    return kwsysProcess_Pipe_None;
  }

  /* Record the time at which user timeout period starts.  */
  if (userTimeout) {
    userStartTime = kwsysProcessTimeGetCurrent();
  }

  /* Calculate the time at which a timeout will expire, and whether it
     is the user or process timeout.  */
  wd.User = kwsysProcessGetTimeoutTime(cp, userTimeout, &wd.TimeoutTime);

  /* Data can only be available when pipes are open.  If the process
     is not running, cp->PipesLeft will be 0.  */
  while (cp->PipesLeft > 0 &&
         !kwsysProcessWaitForPipe(cp, data, length, &wd)) {
  }

  /* Update the user timeout.  */
  if (userTimeout) {
    kwsysProcessTime userEndTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime difference =
      kwsysProcessTimeSubtract(userEndTime, userStartTime);
    double d = kwsysProcessTimeToDouble(difference);
    *userTimeout -= d;
    if (*userTimeout < 0) {
      *userTimeout = 0;
    }
  }

  /* Check what happened.  */
  if (wd.PipeId) {
    /* Data are ready on a pipe.  */
    return wd.PipeId;
  }
  if (wd.Expired) {
    /* A timeout has expired.  */
    if (wd.User) {
      /* The user timeout has expired.  It has no time left.  */
      return kwsysProcess_Pipe_Timeout;
    }

    /* The process timeout has expired.  Kill the children now.  */
    kwsysProcess_Kill(cp);
    cp->Killed = 0;
    cp->TimeoutExpired = 1;
    return kwsysProcess_Pipe_None;
  }
  /* No pipes are left open.  */
  return kwsysProcess_Pipe_None;
}